

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void no_epollin_on_closed_empty_pipe_impl(_Bool do_write_data)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  undefined1 local_35 [8];
  epoll_event event_result;
  uint8_t data;
  epoll_event event;
  int fds [3];
  int ep;
  _Bool do_write_data_local;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2c4,"ep >= 0");
  }
  fd_pipe(&event.data.fd);
  event_result.data.u64._1_4_ = 0x2001;
  stack0xffffffffffffffdc = event.data.fd;
  iVar2 = epoll_ctl(iVar1,1,event.data.fd,(epoll_event *)((long)&event_result.data + 1));
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2cd,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0");
  }
  event_result.data.fd._0_1_ = 0;
  if (do_write_data) {
    write(event.data.u64._4_4_,&event_result.data,1);
  }
  close(event.data.u64._4_4_);
  iVar2 = epoll_wait(iVar1,(epoll_event *)local_35,1,-1);
  if (iVar2 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2d6);
  }
  if (local_35._0_4_ != (do_write_data | 0x10)) {
    microatf_fail_require
              ("%s:%d: %x",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2da,local_35._0_4_);
  }
  sVar3 = read(event.data.fd,&event_result.data,1);
  if (sVar3 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2dc,"read(fds[0], &data, 1) >= 0");
  }
  if (local_35._4_4_ != event.data.fd) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2de,"event_result.data.fd == fds[0]");
  }
  iVar2 = close(event.data.fd);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2e0,"close(fds[0]) == 0");
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x2e1,"close(ep) == 0");
  }
  return;
}

Assistant:

static void
no_epollin_on_closed_empty_pipe_impl(bool do_write_data)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_pipe(fds);

	struct epoll_event event;
	event.events = EPOLLIN | EPOLLRDHUP;
	event.data.fd = fds[0];

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0);

	uint8_t data = '\0';
	if (do_write_data) {
		write(fds[1], &data, 1);
	}
	close(fds[1]);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);

	ATF_REQUIRE_MSG(event_result.events ==
		(EPOLLHUP | (do_write_data ? EPOLLIN : 0)),
	    "%x", event_result.events);

	ATF_REQUIRE(read(fds[0], &data, 1) >= 0);

	ATF_REQUIRE(event_result.data.fd == fds[0]);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}